

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void StoreSymbol(BlockEncoder *self,size_t symbol,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  
  if (self->block_len_ == 0) {
    sVar4 = self->block_ix_;
    self->block_ix_ = sVar4 + 1;
    uVar10 = self->block_lengths_[sVar4 + 1];
    uVar5 = (ulong)self->block_types_[sVar4 + 1];
    self->block_len_ = (ulong)uVar10;
    self->entropy_ix_ = self->alphabet_size_ * uVar5;
    sVar4 = (self->block_split_code_).type_code_calculator.last_type;
    lVar8 = 1;
    if (sVar4 + 1 != uVar5) {
      lVar8 = 0;
      if ((self->block_split_code_).type_code_calculator.second_last_type != uVar5) {
        lVar8 = uVar5 + 2;
      }
    }
    (self->block_split_code_).type_code_calculator.second_last_type = sVar4;
    (self->block_split_code_).type_code_calculator.last_type = uVar5;
    bVar1 = (self->block_split_code_).type_depths[lVar8];
    uVar2 = (self->block_split_code_).type_bits[lVar8];
    if (uVar2 >> (bVar1 & 0x3f) != 0) goto LAB_0011761f;
    if (0x38 < bVar1) goto LAB_0011763e;
    uVar5 = *storage_ix;
    uVar7 = bVar1 + uVar5;
    *(ulong *)(storage + (uVar5 >> 3)) =
         (ulong)uVar2 << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
    *storage_ix = uVar7;
    lVar8 = 0xe;
    if (0x2f0 < uVar10) {
      lVar8 = 0x14;
    }
    lVar6 = 7;
    if (uVar10 < 0x29) {
      lVar6 = 0;
    }
    if (0xb0 < uVar10) {
      lVar6 = lVar8;
    }
    uVar5 = lVar6 - 1;
    do {
      if (uVar5 == 0x18) {
        uVar9 = 0x19;
        break;
      }
      uVar9 = uVar5 + 1;
      lVar8 = uVar5 + 2;
      uVar5 = uVar9;
    } while (kBlockLengthPrefixCode[lVar8].offset <= uVar10);
    uVar9 = uVar9 & 0xffffffff;
    bVar1 = (self->block_split_code_).length_depths[uVar9];
    uVar2 = (self->block_split_code_).length_bits[uVar9];
    if (uVar2 >> (bVar1 & 0x3f) != 0) goto LAB_0011761f;
    if (0x38 < bVar1) goto LAB_0011763e;
    uVar3 = kBlockLengthPrefixCode[uVar9].nbits;
    uVar10 = uVar10 - kBlockLengthPrefixCode[uVar9].offset;
    *(ulong *)(storage + (uVar7 >> 3)) =
         (ulong)uVar2 << ((byte)uVar7 & 7) | (ulong)storage[uVar7 >> 3];
    uVar7 = bVar1 + uVar7;
    *storage_ix = uVar7;
    if (uVar10 >> ((byte)uVar3 & 0x3f) != 0) goto LAB_0011761f;
    *(ulong *)(storage + (uVar7 >> 3)) =
         (ulong)uVar10 << ((byte)uVar7 & 7) | (ulong)storage[uVar7 >> 3];
    *storage_ix = uVar3 + uVar7;
  }
  self->block_len_ = self->block_len_ - 1;
  lVar8 = symbol + self->entropy_ix_;
  bVar1 = self->depths_[lVar8];
  if (self->bits_[lVar8] >> (bVar1 & 0x3f) == 0) {
    if (bVar1 < 0x39) {
      uVar5 = *storage_ix;
      *(ulong *)(storage + (uVar5 >> 3)) =
           (ulong)self->bits_[lVar8] << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
      *storage_ix = bVar1 + uVar5;
      return;
    }
LAB_0011763e:
    __assert_fail("n_bits <= 56",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                  ,0x37,
                  "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
  }
LAB_0011761f:
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                ,0x36,"void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
  ;
}

Assistant:

static void StoreSymbol(BlockEncoder* self, size_t symbol, size_t* storage_ix,
    uint8_t* storage) {
  if (self->block_len_ == 0) {
    size_t block_ix = ++self->block_ix_;
    uint32_t block_len = self->block_lengths_[block_ix];
    uint8_t block_type = self->block_types_[block_ix];
    self->block_len_ = block_len;
    self->entropy_ix_ = block_type * self->alphabet_size_;
    StoreBlockSwitch(&self->block_split_code_, block_len, block_type, 0,
        storage_ix, storage);
  }
  --self->block_len_;
  {
    size_t ix = self->entropy_ix_ + symbol;
    BrotliWriteBits(self->depths_[ix], self->bits_[ix], storage_ix, storage);
  }
}